

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

void __thiscall pmoment_filtration::~pmoment_filtration(pmoment_filtration *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {
		return (max(boundary_filtration, 0, dimension) +
		        pow(
		            [&]() {
			            value_t EXPRESSION_0 = 0.0f;
			            for (int COUNTER_A = (int)0; COUNTER_A <= (int)dimension; COUNTER_A++) {
				            EXPRESSION_0 += (pow((boundary_filtration[COUNTER_A] -
				                                  sum(boundary_filtration, 0, dimension) / (dimension + 1.0f)),
				                                 2.0f));
			            }
			            return EXPRESSION_0;
		            }(),
		            (1.0f / 2.0f)) /
		            (dimension + 1.0f));
	}